

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O3

double Tools::NormalizeAngle(double a,int debug)

{
  long *plVar1;
  int iVar2;
  
  iVar2 = 0;
  if (3.141592653589793 < a) {
    iVar2 = 0;
    do {
      a = a + -6.283185307179586;
      iVar2 = iVar2 + 1;
    } while (3.141592653589793 < a);
  }
  for (; a < -3.141592653589793; a = a + 6.283185307179586) {
    iVar2 = iVar2 + 1;
  }
  if (debug != 0 && iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"normalize operations: ",0x16);
    plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
  }
  return a;
}

Assistant:

double Tools::NormalizeAngle(double a, int debug) {
#if defined(NORM_ANGLE_LOOP)
    int n = 0;
    while (a > M_PI)  {a -= Tools::PI2; n++;}
    while (a < -M_PI) {a += Tools::PI2; n++;}
    if (n>0 && debug)
        std::cout << "normalize operations: " << n  << std::endl; 
    return a;
#elif defined(NORM_ANGLE_CEIL)
    return a - ceil((a-M_PI)/(Tools::PI2))*Tools::PI2;
#else
    return a;
#endif
}